

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

DObject * __thiscall PClass::CreateNew(PClass *this)

{
  DObject *this_00;
  BYTE *mem;
  PClass *this_local;
  
  this_00 = (DObject *)
            M_Malloc_Dbg((ulong)*(uint *)&(this->super_PStruct).super_PNamedType.super_PCompoundType
                                          .super_PType.super_DObject.field_0x24,
                         "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                         ,0xc3a);
  if (this_00 != (DObject *)0x0) {
    if (this->Defaults == (BYTE *)0x0) {
      memset(this_00,0,
             (ulong)*(uint *)&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType
                              .super_DObject.field_0x24);
    }
    else {
      memcpy(this_00,this->Defaults,
             (ulong)*(uint *)&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType
                              .super_DObject.field_0x24);
    }
    (*this->ConstructNative)(this_00);
    DObject::SetClass(this_00,this);
    if (this->Defaults != (BYTE *)0x0) {
      InitializeSpecials(this,this_00);
    }
    return this_00;
  }
  __assert_fail("mem != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                ,0xc3b,"DObject *PClass::CreateNew() const");
}

Assistant:

DObject *PClass::CreateNew() const
{
	BYTE *mem = (BYTE *)M_Malloc (Size);
	assert (mem != NULL);

	// Set this object's defaults before constructing it.
	if (Defaults != NULL)
		memcpy (mem, Defaults, Size);
	else
		memset (mem, 0, Size);

	ConstructNative (mem);
	((DObject *)mem)->SetClass (const_cast<PClass *>(this));
	if (Defaults != NULL)
	{
		InitializeSpecials(mem);
	}
	return (DObject *)mem;
}